

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O2

void __thiscall
Zuker::lambda_swipe_3(Zuker *this,double threshold,double threshold2,ostream *fout,string *outfile)

{
  vector<int,_std::allocator<int>_> *protein;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  ostream *poVar6;
  double right_lambda;
  double left_lambda;
  mapped_type local_300;
  double left_O;
  double local_2f0;
  double right_mfe;
  double right_cai;
  double left_mfe;
  double left_cai;
  string left_rna;
  double local_2a0;
  double right_CAI;
  double left_CAI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  vector<double,_std::allocator<double>_> C_buffer;
  vector<double,_std::allocator<double>_> MFE_buffer;
  vector<double,_std::allocator<double>_> stand_CAI;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  vector<double,_std::allocator<double>_> O_buffer;
  string right_rna;
  string right_bp;
  string left_bp;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  mfe_map;
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  lambda;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  cai_map;
  
  O_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  O_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  O_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lambda_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lambda_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lambda_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  F_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  F_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  F_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CAI_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  CAI_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CAI_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  stand_CAI.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stand_CAI.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stand_CAI.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MFE_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  MFE_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  MFE_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  C_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  C_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  C_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&dataset,7,(allocator_type *)&lambda);
  std::
  queue<std::pair<double,double>,std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
  ::queue<std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>,void>
            (&lambda);
  mfe_map._M_h._M_buckets = &mfe_map._M_h._M_single_bucket;
  mfe_map._M_h._M_bucket_count = 1;
  mfe_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mfe_map._M_h._M_element_count = 0;
  mfe_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mfe_map._M_h._M_rehash_policy._M_next_resize = 0;
  mfe_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cai_map._M_h._M_buckets = &cai_map._M_h._M_single_bucket;
  cai_map._M_h._M_bucket_count = 1;
  left_CAI = 0.0;
  cai_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cai_map._M_h._M_element_count = 0;
  left_cai = 0.0;
  cai_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  left_mfe = 0.0;
  cai_map._M_h._M_rehash_policy._M_next_resize = 0;
  cai_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  right_CAI = 10000000.0;
  right_cai = 10000000.0;
  right_mfe = 10000000.0;
  left_rna._M_dataplus._M_p = (pointer)0x3ee4f8b588e368f1;
  left_rna._M_string_length = 0x3fefffeb074a771d;
  std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<std::pair<double,double>>
            ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&lambda,
             (pair<double,_double> *)&left_rna);
  protein = &this->protein;
  while (lambda.c.
         super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur !=
         lambda.c.
         super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur) {
    left_lambda = (lambda.c.
                   super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
    right_lambda = (lambda.c.
                    super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
    std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::pop_front
              (&lambda.c);
    left_rna._M_dataplus._M_p = (pointer)&left_rna.field_2;
    std::__cxx11::string::_M_construct((ulong)&left_rna,(char)this->n * '\x03');
    left_bp._M_dataplus._M_p = (pointer)&left_bp.field_2;
    std::__cxx11::string::_M_construct((ulong)&left_bp,(char)this->n * '\x03');
    right_rna._M_dataplus._M_p = (pointer)&right_rna.field_2;
    std::__cxx11::string::_M_construct((ulong)&right_rna,(char)this->n * '\x03');
    right_bp._M_dataplus._M_p = (pointer)&right_bp.field_2;
    std::__cxx11::string::_M_construct((ulong)&right_bp,(char)this->n * '\x03');
    sVar3 = std::
            _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&mfe_map._M_h,&left_lambda);
    if (sVar3 == 0) {
      reinit(this);
      std::operator<<(fout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(left_lambda);
      std::endl<char,std::char_traits<char>>(poVar6);
      left_O = calculate_CAI_O(this,fout,left_lambda);
      traceback_B2(this,left_lambda);
      get_rna_cai(this,&left_rna);
      get_bp(this,&left_bp);
      left_CAI = evaluate_CAI(&left_rna,protein,1);
      left_cai = evaluate_CAI(&left_rna,protein,0);
      local_300 = evaluate_MFE(&left_rna);
      left_mfe = local_300;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&mfe_map,&left_lambda);
      *pmVar4 = local_300;
      local_300 = left_cai;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&cai_map,&left_lambda);
      *pmVar4 = local_300;
      std::vector<double,_std::allocator<double>_>::push_back
                (&O_buffer,(value_type_conflict2 *)&left_O);
      std::vector<double,_std::allocator<double>_>::push_back(&lambda_buffer,&left_lambda);
      std::vector<double,_std::allocator<double>_>::push_back(&F_buffer,&left_mfe);
      std::vector<double,_std::allocator<double>_>::push_back(&CAI_buffer,&left_CAI);
      std::vector<double,_std::allocator<double>_>::push_back(&stand_CAI,&left_cai);
      pcVar5 = index(this,(char *)0x0,this->n + -1);
      iVar2 = (int)pcVar5;
      local_2a0 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] / left_lambda;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&MFE_buffer,&local_2a0);
      local_2a0 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] / (left_lambda + -1.0);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&C_buffer,&local_2a0);
      poVar6 = std::operator<<(fout,"rna: ");
      poVar6 = std::operator<<(poVar6,(string *)&left_rna);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(fout,"bp: ");
      poVar6 = std::operator<<(poVar6,(string *)&left_bp);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(left_lambda);
      std::operator<<(poVar6,",O: ");
      poVar6 = std::ostream::_M_insert<double>(left_O);
      std::operator<<(poVar6,",cai: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] / (left_lambda + -1.0));
      std::operator<<(poVar6,",mfe: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] / left_lambda);
      std::operator<<(poVar6,",integrated: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] +
                          (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2]);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(left_lambda);
      std::operator<<(poVar6,",O: ");
      poVar6 = std::ostream::_M_insert<double>(left_O);
      std::operator<<(poVar6,",cai: ");
      poVar6 = std::ostream::_M_insert<double>(left_CAI);
      std::operator<<(poVar6,",sCAI: ");
      poVar6 = std::ostream::_M_insert<double>(left_cai);
      std::operator<<(poVar6,",mfe: ");
      poVar6 = std::ostream::_M_insert<double>(left_mfe);
      std::operator<<(poVar6,",combined: ");
      poVar6 = std::ostream::_M_insert<double>
                         (left_lambda * left_mfe + (left_lambda + -1.0) * left_CAI);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&cai_map,&left_lambda);
      left_cai = *pmVar4;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&mfe_map,&left_lambda);
      left_mfe = *pmVar4;
    }
    sVar3 = std::
            _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&mfe_map._M_h,&right_lambda);
    if (sVar3 == 0) {
      reinit(this);
      std::operator<<(fout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(right_lambda);
      std::endl<char,std::char_traits<char>>(poVar6);
      left_O = calculate_CAI_O(this,fout,right_lambda);
      traceback_B2(this,right_lambda);
      get_rna_cai(this,&right_rna);
      get_bp(this,&right_bp);
      right_CAI = evaluate_CAI(&right_rna,protein,1);
      right_cai = evaluate_CAI(&right_rna,protein,0);
      local_300 = evaluate_MFE(&right_rna);
      right_mfe = local_300;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&mfe_map,&right_lambda);
      *pmVar4 = local_300;
      local_300 = right_cai;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&cai_map,&right_lambda);
      *pmVar4 = local_300;
      std::vector<double,_std::allocator<double>_>::push_back
                (&O_buffer,(value_type_conflict2 *)&left_O);
      std::vector<double,_std::allocator<double>_>::push_back(&lambda_buffer,&right_lambda);
      std::vector<double,_std::allocator<double>_>::push_back(&F_buffer,&right_mfe);
      std::vector<double,_std::allocator<double>_>::push_back(&CAI_buffer,&right_CAI);
      std::vector<double,_std::allocator<double>_>::push_back(&stand_CAI,&right_cai);
      pcVar5 = index(this,(char *)0x0,this->n + -1);
      iVar2 = (int)pcVar5;
      local_2a0 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] / right_lambda;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&MFE_buffer,&local_2a0);
      local_2a0 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] / (right_lambda + -1.0);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&C_buffer,&local_2a0);
      poVar6 = std::operator<<(fout,"rna: ");
      poVar6 = std::operator<<(poVar6,(string *)&right_rna);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(fout,"bp: ");
      poVar6 = std::operator<<(poVar6,(string *)&right_bp);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(right_lambda);
      std::operator<<(poVar6,",O: ");
      poVar6 = std::ostream::_M_insert<double>(left_O);
      std::operator<<(poVar6,",cai: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] / (right_lambda + -1.0));
      std::operator<<(poVar6,",mfe: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] / right_lambda);
      std::operator<<(poVar6,",integrated: ");
      poVar6 = std::ostream::_M_insert<double>
                         ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2] +
                          (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2]);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"lambda: ");
      poVar6 = std::ostream::_M_insert<double>(right_lambda);
      std::operator<<(poVar6,",O: ");
      poVar6 = std::ostream::_M_insert<double>(left_O);
      std::operator<<(poVar6,",cai: ");
      poVar6 = std::ostream::_M_insert<double>(right_CAI);
      std::operator<<(poVar6,",sCAI: ");
      poVar6 = std::ostream::_M_insert<double>(right_cai);
      std::operator<<(poVar6,",mfe: ");
      poVar6 = std::ostream::_M_insert<double>(right_mfe);
      std::operator<<(poVar6,",combined: ");
      poVar6 = std::ostream::_M_insert<double>
                         (right_lambda * right_mfe + (right_lambda + -1.0) * right_CAI);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&cai_map,&right_lambda);
      right_cai = *pmVar4;
      pmVar4 = std::__detail::
               _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&mfe_map,&right_lambda);
      right_mfe = *pmVar4;
    }
    bVar1 = compare(left_cai,right_cai,1e-05);
    if ((!bVar1) && (bVar1 = compare(left_mfe,right_mfe,1e-05), !bVar1)) {
      std::operator<<((ostream *)&std::cout,"lamda diff: ");
      poVar6 = std::ostream::_M_insert<double>(right_lambda - left_lambda);
      std::endl<char,std::char_traits<char>>(poVar6);
      if (threshold <= right_lambda) {
        bVar1 = compare(left_lambda,right_lambda,threshold);
        if (!bVar1) {
          left_O = left_lambda;
          local_300 = left_lambda * 0.4 + right_lambda * 0.6;
          local_2f0 = local_300;
          std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          emplace_back<std::pair<double,double>>
                    ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &lambda,(pair<double,_double> *)&left_O);
          left_O = local_300;
          local_2f0 = right_lambda;
          std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          emplace_back<std::pair<double,double>>
                    ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &lambda,(pair<double,_double> *)&left_O);
        }
      }
      else {
        bVar1 = compare(left_lambda,right_lambda,threshold2);
        if (!bVar1) {
          left_O = left_lambda;
          local_300 = left_lambda * 0.4 + right_lambda * 0.6;
          local_2f0 = local_300;
          std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          emplace_back<std::pair<double,double>>
                    ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &lambda,(pair<double,_double> *)&left_O);
          left_O = local_300;
          local_2f0 = right_lambda;
          std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          emplace_back<std::pair<double,double>>
                    ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &lambda,(pair<double,_double> *)&left_O);
        }
      }
    }
    std::__cxx11::string::~string((string *)&right_bp);
    std::__cxx11::string::~string((string *)&right_rna);
    std::__cxx11::string::~string((string *)&left_bp);
    std::__cxx11::string::~string((string *)&left_rna);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"size : ");
  std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
            (&lambda.c);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<(fout,"left lambda: ");
  poVar6 = std::ostream::_M_insert<double>(left_lambda);
  std::operator<<(poVar6,",right lambda: ");
  poVar6 = std::ostream::_M_insert<double>(right_lambda);
  std::endl<char,std::char_traits<char>>(poVar6);
  left_rna._M_dataplus._M_p = "lambda";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&lambda_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             dataset.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p = "rc_mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&F_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p = "rc_CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&CAI_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p = "rc_sCAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&stand_CAI);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p._0_1_ = 0x4f;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&O_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4),
             (pair<char,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p = "mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&MFE_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  left_rna._M_dataplus._M_p = "CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&left_rna._M_string_length,&C_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&left_rna);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&left_rna._M_string_length);
  std::operator+(&local_88,outfile,".csv");
  write_csv(&local_88,&dataset);
  std::__cxx11::string::~string((string *)&local_88);
  poVar6 = std::operator<<((ostream *)&std::cout,"swipe done");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&cai_map._M_h);
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&mfe_map._M_h);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&lambda);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&dataset);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&C_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&MFE_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&stand_CAI.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&CAI_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&F_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lambda_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&O_buffer.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Zuker::lambda_swipe_3(double threshold, double threshold2, ostream &fout, string & outfile) {
    double left_lambda;
    double right_lambda;
    vector<double> O_buffer,lambda_buffer,F_buffer,CAI_buffer,stand_CAI;
    vector<double> MFE_buffer, C_buffer;
    vector<pair<string, vector<double>>> dataset(7);
    queue<pair<double, double>> lambda;
    unordered_map<double, double> mfe_map;
    unordered_map<double, double> cai_map;
    double left_CAI = 0, left_cai = 0, left_mfe = 0, right_CAI = inf, right_cai = inf, right_mfe = inf;

    lambda.push({EPSILON,1-EPSILON});
    int idx;

    while (!lambda.empty()) {
        left_lambda=  lambda.front().first, right_lambda = lambda.front().second;
        lambda.pop();
        string left_rna(3*n, '.'), left_bp(3*n, '.'), right_rna(3*n, '.'), right_bp(3*n, '.');
        if (mfe_map.count(left_lambda) != 0) {
            left_cai = cai_map[left_lambda];
            left_mfe = mfe_map[left_lambda];
        } else {
            reinit();
            fout << "lambda: " << left_lambda << endl;
            double left_O = calculate_CAI_O(fout,left_lambda);
            traceback_B2(left_lambda);
            get_rna_cai(left_rna);
            get_bp(left_bp);
            left_CAI = evaluate_CAI(left_rna, protein, 1);
            left_cai = evaluate_CAI(left_rna, protein, 0);
            left_mfe = evaluate_MFE(left_rna);
            mfe_map[left_lambda] = left_mfe;
            cai_map[left_lambda] = left_cai;
            O_buffer.push_back(left_O);
            lambda_buffer.push_back(left_lambda);
            F_buffer.push_back(left_mfe);
            CAI_buffer.push_back(left_CAI);
            stand_CAI.push_back(left_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / left_lambda);
            C_buffer.push_back(Z_CAI[idx] / (left_lambda-1));
            fout << "rna: " << left_rna << endl;
            fout << "bp: " << left_bp << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << Z_CAI[idx] / (left_lambda-1) << ",mfe: " << Z2[idx] / left_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << left_CAI << ",sCAI: " << left_cai << ",mfe: " << left_mfe << ",combined: " << left_lambda*left_mfe+(left_lambda-1)*left_CAI << endl;

        }

        if (mfe_map.count(right_lambda) != 0) {
            right_cai = cai_map[right_lambda];
            right_mfe = mfe_map[right_lambda];
        } else {
            reinit();
            fout << "lambda: " << right_lambda << endl;
            double right_O = calculate_CAI_O(fout,right_lambda);
            traceback_B2(right_lambda);
            get_rna_cai(right_rna);
            get_bp(right_bp);
            right_CAI = evaluate_CAI(right_rna, protein, 1);
            right_cai = evaluate_CAI(right_rna, protein, 0);
            right_mfe = evaluate_MFE(right_rna);
            mfe_map[right_lambda] = right_mfe;
            cai_map[right_lambda] = right_cai;
            O_buffer.push_back(right_O);
            lambda_buffer.push_back(right_lambda);
            F_buffer.push_back(right_mfe);
            CAI_buffer.push_back(right_CAI);
            stand_CAI.push_back(right_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / right_lambda);
            C_buffer.push_back(Z_CAI[idx] / (right_lambda-1));
            fout << "rna: " << right_rna << endl;
            fout << "bp: " << right_bp << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << Z_CAI[idx] / (right_lambda-1) << ",mfe: " << Z2[idx] / right_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << right_CAI << ",sCAI: " << right_cai << ",mfe: " << right_mfe << ",combined: " << right_lambda*right_mfe+(right_lambda-1)*right_CAI << endl;

        }
        if (!compare(left_cai, right_cai) && !compare(left_mfe, right_mfe)) {
            cout << "lamda diff: " << right_lambda-left_lambda << endl;
            if (right_lambda < threshold) {
                if (!compare(left_lambda,right_lambda,threshold2)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            } else {
                if (!compare(left_lambda,right_lambda,threshold)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            }

        }
    }
    cout << "size : " << lambda.size() << endl;
    fout << "left lambda: " << left_lambda << ",right lambda: " << right_lambda << endl;
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("rc_mfe", F_buffer);
    dataset[2] = make_pair("rc_CAI", CAI_buffer);
    dataset[3] = make_pair("rc_sCAI", stand_CAI);
    dataset[4] = make_pair('O', O_buffer);
    dataset[5] = make_pair("mfe", MFE_buffer);
    dataset[6] = make_pair("CAI", C_buffer);
    write_csv(outfile + ".csv", dataset);
    cout << "swipe done" << endl;
}